

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::MultiPortSymbol::MultiPortSymbol
          (MultiPortSymbol *this,string_view name,SourceLocation loc,
          span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL> ports,
          ArgumentDirection direction)

{
  string_view name_00;
  SourceLocation in_RCX;
  char *in_RDX;
  size_t in_RSI;
  Symbol *in_RDI;
  undefined8 in_R8;
  size_t in_R9;
  undefined4 in_stack_00000008;
  
  name_00._M_str = in_RDX;
  name_00._M_len = in_RSI;
  Symbol::Symbol(in_RDI,MultiPort,name_00,in_RCX);
  *(undefined8 *)(in_RDI + 1) = in_R8;
  in_RDI[1].name._M_len = in_R9;
  *(undefined4 *)&in_RDI[1].name._M_str = in_stack_00000008;
  *(undefined1 *)((long)&in_RDI[1].name._M_str + 4) = 0;
  in_RDI[1].location = (SourceLocation)0x0;
  return;
}

Assistant:

MultiPortSymbol::MultiPortSymbol(std::string_view name, SourceLocation loc,
                                 std::span<const PortSymbol* const> ports,
                                 ArgumentDirection direction) :
    Symbol(SymbolKind::MultiPort, name, loc), ports(ports), direction(direction) {
}